

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

void ossaddsb_input(osgen_txtwin_t *win,char *p,int add_nl)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  ulong len;
  
  for (uVar2 = strlen(p); uVar2 != 0; uVar2 = uVar2 - len) {
    iVar1 = (win->base).x;
    sVar4 = (win->base).wid;
    if ((int)sVar4 <= iVar1) {
      osssb_new_line(win);
      sVar4 = (win->base).wid;
      iVar1 = (win->base).x;
    }
    len = sVar4 - (long)iVar1;
    if (uVar2 < sVar4 - (long)iVar1) {
      len = uVar2;
    }
    ossaddsb(win,p,len,0);
    p = p + len;
  }
  if (add_nl != 0) {
    osssb_new_line(win);
    return;
  }
  iVar1 = osssb_add_byte(win,'\0');
  if (iVar1 != 0) {
    pcVar3 = win->txtfree;
    if (win->txtbuf == pcVar3) {
      pcVar3 = win->txtbuf + win->txtbufsiz;
    }
    win->txtfree = pcVar3 + -1;
  }
  return;
}

Assistant:

void ossaddsb_input(osgen_txtwin_t *win, char *p, int add_nl)
{
    size_t chars_rem;
    
    /* get the number of characters in the input to add */
    chars_rem = strlen(p);

    /* 
     *   add the input in chunks, wrapping whenever we reach the right edge
     *   of the window 
     */
    while (chars_rem != 0)
    {
        size_t wid_rem;
        size_t cur;
        
        /* if we're already past the edge, add a newline */
        if (win->base.x >= (int)win->base.wid)
            osssb_new_line(win);

        /* figure out how much space we have */
        wid_rem = win->base.wid - win->base.x;

        /* add as much as we can, up to the width remaining */
        cur = chars_rem;
        if (cur > wid_rem)
            cur = wid_rem;

        /* add the text */
        ossaddsb(win, p, cur, FALSE);

        /* skip this chunk */
        p += cur;
        chars_rem -= cur;
    }

    /* add a newline after the input if desired */
    if (add_nl)
        osssb_new_line(win);
    else
        osssb_add_safety_null(win);
}